

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O0

size_t read_cached_simple_label(shared_data *sd,void *v,io_buf *cache)

{
  label_data *plVar1;
  size_t total;
  char *c;
  label_data *ld;
  label_data *ld_00;
  shared_data *in_stack_ffffffffffffffd0;
  size_t in_stack_fffffffffffffff8;
  
  ld_00 = (label_data *)0xc;
  plVar1 = (label_data *)io_buf::buf_read((io_buf *)c,(char **)total,in_stack_fffffffffffffff8);
  if (plVar1 < ld_00) {
    ld_00 = (label_data *)0x0;
  }
  else {
    bufread_simple_label(in_stack_ffffffffffffffd0,ld_00,(char *)0x38d46d);
  }
  return (size_t)ld_00;
}

Assistant:

size_t read_cached_simple_label(shared_data* sd, void* v, io_buf& cache)
{
  label_data* ld = (label_data*)v;
  char* c;
  size_t total = sizeof(ld->label) + sizeof(ld->weight) + sizeof(ld->initial);
  if (cache.buf_read(c, total) < total)
    return 0;
  bufread_simple_label(sd, ld, c);

  return total;
}